

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QDBusUnixFileDescriptor>::emplace<QDBusUnixFileDescriptor_const&>
          (QMovableArrayOps<QDBusUnixFileDescriptor> *this,qsizetype i,QDBusUnixFileDescriptor *args
          )

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  QDBusUnixFileDescriptor *pQVar4;
  Inserter *in_RDX;
  QDBusUnixFileDescriptor *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QDBusUnixFileDescriptor tmp;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar7;
  Inserter *this_00;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QDBusUnixFileDescriptor>::needsDetach
                    ((QArrayDataPointer<QDBusUnixFileDescriptor> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QDBusUnixFileDescriptor>::freeSpaceAtEnd
                          ((QArrayDataPointer<QDBusUnixFileDescriptor> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QDBusUnixFileDescriptor>::end
                         ((QArrayDataPointer<QDBusUnixFileDescriptor> *)in_RDI);
      QDBusUnixFileDescriptor::QDBusUnixFileDescriptor(pQVar4,(QDBusUnixFileDescriptor *)in_RDX);
      in_RDI->displaceTo = in_RDI->displaceTo + 1;
      goto LAB_00ad2b1a;
    }
    if ((in_RSI == (QDBusUnixFileDescriptor *)0x0) &&
       (qVar3 = QArrayDataPointer<QDBusUnixFileDescriptor>::freeSpaceAtBegin
                          ((QArrayDataPointer<QDBusUnixFileDescriptor> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QDBusUnixFileDescriptor>::begin
                         ((QArrayDataPointer<QDBusUnixFileDescriptor> *)0xad29f4);
      QDBusUnixFileDescriptor::QDBusUnixFileDescriptor
                (pQVar4 + -8,(QDBusUnixFileDescriptor *)in_RDX);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -8;
      in_RDI->displaceTo = in_RDI->displaceTo + 1;
      goto LAB_00ad2b1a;
    }
  }
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDBusUnixFileDescriptor::QDBusUnixFileDescriptor
            ((QDBusUnixFileDescriptor *)&local_10,(QDBusUnixFileDescriptor *)in_RDX);
  bVar5 = in_RDI->displaceTo != (QDBusUnixFileDescriptor *)0x0;
  uVar6 = bVar5 && in_RSI == (QDBusUnixFileDescriptor *)0x0;
  uVar2 = (uint)(bVar5 && in_RSI == (QDBusUnixFileDescriptor *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QDBusUnixFileDescriptor>::detachAndGrow
            ((QArrayDataPointer<QDBusUnixFileDescriptor> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (QDBusUnixFileDescriptor **)
             CONCAT17(uVar1,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffffac,uVar2))),
             (QArrayDataPointer<QDBusUnixFileDescriptor> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QDBusUnixFileDescriptor> *)
                              CONCAT17(uVar1,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffffac,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::insertOne(in_RDI,(QDBusUnixFileDescriptor *)CONCAT17(uVar6,in_stack_ffffffffffffff98))
    ;
    Inserter::~Inserter(in_RDI);
  }
  else {
    pQVar4 = QArrayDataPointer<QDBusUnixFileDescriptor>::begin
                       ((QArrayDataPointer<QDBusUnixFileDescriptor> *)0xad2aae);
    QDBusUnixFileDescriptor::QDBusUnixFileDescriptor
              (pQVar4 + -8,(QDBusUnixFileDescriptor *)&local_10);
    in_RDI->displaceFrom = in_RDI->displaceFrom + -8;
    in_RDI->displaceTo = in_RDI->displaceTo + 1;
  }
  QDBusUnixFileDescriptor::~QDBusUnixFileDescriptor((QDBusUnixFileDescriptor *)&local_10);
LAB_00ad2b1a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }